

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo.cpp
# Opt level: O0

void demo3(void)

{
  IMLE<1,_1,_FastLinearExpert> imleObj;
  Param param;
  int D;
  int d;
  int in_stack_000006bc;
  IMLE<1,_1,_FastLinearExpert> *in_stack_000006c0;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffbc8;
  Matrix<double,_1,_1,_0,_1,_1> *in_stack_fffffffffffffbd0;
  Scalar *in_stack_fffffffffffffbd8;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffcb4;
  Param *in_stack_fffffffffffffcb8;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffcc0;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffd90;
  
  IMLE<1,_1,_FastLinearExpert>::Param::Param(&in_stack_fffffffffffffc10->param);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::Constant(in_stack_fffffffffffffbd8);
  Eigen::Matrix<double,1,1,0,1,1>::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  IMLE<1,_1,_FastLinearExpert>::IMLE
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
  doubleCos1D_train<IMLE<1,1,FastLinearExpert>>(in_stack_000006c0,in_stack_000006bc);
  doubleCos1D_eval<IMLE<1,1,FastLinearExpert>>(in_stack_fffffffffffffd90);
  IMLE<1,_1,_FastLinearExpert>::~IMLE(in_stack_fffffffffffffc10);
  IMLE<1,_1,_FastLinearExpert>::Param::~Param((Param *)0x234ced);
  return;
}

Assistant:

void demo3()
{
    const int d = 1;    //Input dimension
    const int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE<d,D>::Param param;
    param.Psi0 = IMLE<d,D>::X::Constant(0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // IMLE object
    IMLE<d,D> imleObj(param);

    doubleCos1D_train( imleObj );
    doubleCos1D_eval( imleObj );
}